

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O1

void canvas_dataproperties(_glist *x,t_scalar *sc,_binbuf *b)

{
  _gobj *p_Var1;
  t_word tVar2;
  t_scalar *ptVar3;
  _gobj *p_Var4;
  t_template *ptVar5;
  long lVar6;
  int iVar7;
  char *pcVar8;
  t_gobj *x_00;
  int iVar9;
  _gobj **pp_Var10;
  t_scalar *x_01;
  t_gobj *x_02;
  
  glist_noselect(x);
  ptVar3 = (t_scalar *)x->gl_list;
  if (ptVar3 == (t_scalar *)0x0) {
    x_01 = (t_scalar *)0x0;
    iVar7 = -1;
    iVar9 = 0;
  }
  else {
    iVar7 = -1;
    iVar9 = 0;
    x_01 = (t_scalar *)0x0;
    do {
      if (ptVar3 == sc) {
        x_01 = ptVar3;
        iVar7 = iVar9;
      }
      iVar9 = iVar9 + 1;
      ptVar3 = (t_scalar *)(ptVar3->sc_gobj).g_next;
    } while (ptVar3 != (t_scalar *)0x0);
  }
  if (iVar7 == -1) {
    pcVar8 = "data_properties: scalar disappeared";
    goto LAB_0015210d;
  }
  if (b == (_binbuf *)0x0) {
    pcVar8 = "couldn\'t update properties (none given)";
    goto LAB_0015210d;
  }
  glist_readfrombinbuf(x,b,"properties dialog",0);
  x_02 = x->gl_list;
  if (iVar9 == 0) {
    gobj_vis(x_02,x,0);
    pp_Var10 = &x->gl_list;
LAB_001520a7:
    *pp_Var10 = x_02->g_next;
  }
  else {
    x_00 = x_02->g_next;
    if (x_00 != (t_gobj *)0x0) {
      if (iVar9 != 1) {
        iVar9 = iVar9 + -1;
        do {
          x_02 = x_00;
          x_00 = x_02->g_next;
          if (x_00 == (_gobj *)0x0) goto LAB_001520b1;
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
      }
      gobj_vis(x_00,x,0);
      pp_Var10 = &x_02->g_next;
      x_02 = x_00;
      goto LAB_001520a7;
    }
LAB_001520b1:
    x_02 = (t_gobj *)0x0;
  }
  if (x_02 == (t_gobj *)0x0) {
    pcVar8 = "couldn\'t update properties (perhaps a format problem?)";
LAB_0015210d:
    pd_error(x,pcVar8);
    return;
  }
  if (x_01 != (t_scalar *)0x0) {
    if ((((x_02->g_pd == scalar_class) && ((x_01->sc_gobj).g_pd == scalar_class)) &&
        (x_02[1].g_pd == (t_pd)x_01->sc_template)) &&
       (ptVar5 = template_findbyname((t_symbol *)x_02[1].g_pd), ptVar5 != (t_template *)0x0)) {
      if (0 < ptVar5->t_n) {
        lVar6 = 0;
        do {
          tVar2 = *(t_word *)(&x_02[1].g_next + lVar6);
          *(t_word *)(&x_02[1].g_next + lVar6) = x_01->sc_vec[lVar6];
          x_01->sc_vec[lVar6] = tVar2;
          lVar6 = lVar6 + 1;
        } while (lVar6 < ptVar5->t_n);
      }
      pd_free(&x_02->g_pd);
      iVar7 = glist_isvisible(x);
      if (iVar7 != 0) {
        gobj_vis(&x_01->sc_gobj,x,0);
        gobj_vis(&x_01->sc_gobj,x,1);
        return;
      }
    }
    else {
      glist_delete(x,&x_01->sc_gobj);
      p_Var4 = x->gl_list;
      if (iVar7 < 1) {
        x_02->g_next = p_Var4;
        x->gl_list = x_02;
      }
      else {
        if (p_Var4 == (_gobj *)0x0) {
          pcVar8 = "data_properties: can\'t reinsert";
          goto LAB_0015213f;
        }
        if (iVar7 != 1) {
          iVar7 = iVar7 + -1;
          do {
            p_Var1 = p_Var4->g_next;
            if (p_Var1 == (_gobj *)0x0) break;
            iVar7 = iVar7 + -1;
            p_Var4 = p_Var1;
          } while (iVar7 != 0);
        }
        x_02->g_next = p_Var4->g_next;
        p_Var4->g_next = x_02;
      }
    }
    return;
  }
  pcVar8 = "data_properties: couldn\'t find old element";
LAB_0015213f:
  bug(pcVar8);
  return;
}

Assistant:

void canvas_dataproperties(t_canvas *x, t_scalar *sc, t_binbuf *b)
{
    int ntotal, nnew, scindex;
    t_gobj *y, *y2 = 0, *newone, *oldone = 0;
    t_template *template;
    glist_noselect(x);
    for (y = x->gl_list, ntotal = 0, scindex = -1; y; y = y->g_next)
    {
        if (y == &sc->sc_gobj)
            scindex = ntotal, oldone = y;
        ntotal++;
    }

    if (scindex == -1)
    {
        pd_error(x, "data_properties: scalar disappeared");
        return;
    }
    if (!b) {
        pd_error(x, "couldn't update properties (none given)");
        return;
    }
    glist_readfrombinbuf(x, b, "properties dialog", 0);
    newone = 0;
        /* take the new object off the list */
    if (ntotal)
    {
        for (y = x->gl_list, nnew = 1; (y2 = y->g_next);
            y = y2, nnew++)
                if (nnew == ntotal)
        {
            newone = y2;
            gobj_vis(newone, x, 0);
            y->g_next = y2->g_next;
            break;
        }
    }
    else gobj_vis((newone = x->gl_list), x, 0), x->gl_list = newone->g_next;
    if (!newone)
        pd_error(x, "couldn't update properties (perhaps a format problem?)");
    else if (!oldone)
        bug("data_properties: couldn't find old element");
    else if (newone->g_pd == scalar_class && oldone->g_pd == scalar_class
        && ((t_scalar *)newone)->sc_template ==
            ((t_scalar *)oldone)->sc_template
        && (template = template_findbyname(((t_scalar *)newone)->sc_template)))
    {
            /* swap new one with old one; then delete new one */
        int i;
        for (i = 0; i < template->t_n; i++)
        {
            t_word w = ((t_scalar *)newone)->sc_vec[i];
            ((t_scalar *)newone)->sc_vec[i] = ((t_scalar *)oldone)->sc_vec[i];
            ((t_scalar *)oldone)->sc_vec[i] = w;
        }
        pd_free(&newone->g_pd);
        if (glist_isvisible(x))
        {
            gobj_vis(oldone, x, 0);
            gobj_vis(oldone, x, 1);
        }
    }
    else
    {
            /* delete old one; put new one where the old one was on glist */
        glist_delete(x, oldone);
        if (scindex > 0)
        {
            for (y = x->gl_list, nnew = 1; y;
                y = y->g_next, nnew++)
                    if (nnew == scindex || !y->g_next)
            {
                newone->g_next = y->g_next;
                y->g_next = newone;
                goto didit;
            }
            bug("data_properties: can't reinsert");
        }
        else newone->g_next = x->gl_list, x->gl_list = newone;
    }
didit:
    ;
}